

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O1

int __thiscall
SimpleStrategy::countCalls
          (SimpleStrategy *this,
          set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *calls)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  Call c;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_58;
  
  p_Var1 = (calls->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(calls->_M_t)._M_impl.super__Rb_tree_header;
  iVar3 = 0;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_Rb_tree(&local_58,
                 (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)&p_Var1[1]._M_left);
      iVar3 = iVar3 + (int)local_58._M_impl.super__Rb_tree_header._M_node_count;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_58);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return iVar3;
}

Assistant:

int SimpleStrategy::countCalls(const std::set<CfgData::Call>& calls) {
	int total = 0;
	for (CfgData::Call c : calls)
		total += c.calls.size();

	return total;
}